

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O1

int FindNode(sockaddr_in *address)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  in_addr *piVar4;
  
  uVar1 = (uint)doomcom.numnodes;
  if (doomcom.numnodes < 1) {
    uVar3 = 0;
  }
  else {
    piVar4 = &sendaddress[0].sin_addr;
    uVar3 = 0;
    do {
      if (((address->sin_addr).s_addr == piVar4->s_addr) &&
         (address->sin_port == ((sockaddr_in *)(piVar4 + -1))->sin_port)) goto LAB_004bdbaa;
      uVar3 = uVar3 + 1;
      piVar4 = piVar4 + 4;
    } while (uVar1 != uVar3);
    uVar3 = (ulong)uVar1;
  }
LAB_004bdbaa:
  uVar2 = 0xffffffff;
  if ((uint)uVar3 != uVar1) {
    uVar2 = (uint)uVar3;
  }
  return uVar2;
}

Assistant:

int FindNode (const sockaddr_in *address)
{
	int i;

	// find remote node number
	for (i = 0; i<doomcom.numnodes; i++)
		if (address->sin_addr.s_addr == sendaddress[i].sin_addr.s_addr
			&& address->sin_port == sendaddress[i].sin_port)
			break;

	if (i == doomcom.numnodes)
	{
		// packet is not from one of the players (new game broadcast?)
		i = -1;
	}
	return i;
}